

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetAutoUicOptions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  cmLocalGenerator *lg;
  char *pcVar1;
  pointer this_00;
  string *arg;
  string local_158;
  undefined1 local_138 [16];
  string local_128;
  undefined1 local_108 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  undefined1 local_70 [8];
  cmGeneratorExpression ge;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *prop;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  cmGeneratorTarget *this_local;
  
  prop = (char *)config;
  config_local = (string *)result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"AUTOUIC_OPTIONS",&local_49);
  pcVar1 = GetLinkInterfaceDependentStringProperty(this,&local_48,(string *)prop);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (pcVar1 != (char *)0x0) {
    dagChecker.CheckResult = DAG;
    dagChecker.TransitivePropertiesOnly = false;
    dagChecker._125_3_ = 0;
    local_28 = pcVar1;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&dagChecker.CheckResult);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_70,(cmListFileBacktrace *)&dagChecker.CheckResult);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&dagChecker.CheckResult);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"AUTOUIC_OPTIONS",(allocator<char> *)(local_138 + 0xf));
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_108,this,&local_128,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)(local_138 + 0xf));
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_138,local_70);
    this_00 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)local_138);
    pcVar1 = prop;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_158);
    arg = cmCompiledGeneratorExpression::Evaluate
                    (this_00,lg,(string *)pcVar1,false,this,
                     (cmGeneratorExpressionDAGChecker *)local_108,&local_158);
    cmSystemTools::ExpandListArgument
              (arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)config_local,false);
    std::__cxx11::string::~string((string *)&local_158);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_138);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_108);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_70);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAutoUicOptions(std::vector<std::string>& result,
                                          const std::string& config) const
{
  const char* prop =
    this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS", config);
  if (!prop) {
    return;
  }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(this, "AUTOUIC_OPTIONS", nullptr,
                                             nullptr);
  cmSystemTools::ExpandListArgument(
    ge.Parse(prop)->Evaluate(this->LocalGenerator, config, false, this,
                             &dagChecker),
    result);
}